

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

int Fra_ClassesRefine1(Fra_Cla_t *p,int fRefineNewClass,int *pSkipped)

{
  Aig_Obj_t **Entry;
  int iVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int nSizeNew;
  long lVar7;
  int iVar8;
  
  if (p->vClasses1->nSize == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClasses1,0);
    if (pAVar2 == p->pAig->pConst1) {
      __assert_fail("Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                    ,0x217,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
    }
    p->vClassNew->nSize = 0;
    nSizeNew = 0;
    for (; pVVar6 = p->vClasses1, iVar8 < pVVar6->nSize; iVar8 = iVar8 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,iVar8);
      iVar1 = (*p->pFuncNodeIsConst)(pAVar2);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar2);
      }
      else {
        Vec_PtrWriteEntry(p->vClasses1,nSizeNew,pAVar2);
        nSizeNew = nSizeNew + 1;
      }
    }
    Vec_PtrShrink(pVVar6,nSizeNew);
    pVVar6 = p->vClassNew;
    iVar8 = pVVar6->nSize;
    uVar3 = (ulong)iVar8;
    if (uVar3 != 0) {
      if (iVar8 == 1) {
        pvVar4 = Vec_PtrEntry(pVVar6,0);
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x30) + 8) +
         (long)*(int *)((long)pvVar4 + 0x24) * 8) = 0;
        iVar8 = 1;
      }
      else {
        Entry = p->pMemClassesFree;
        p->pMemClassesFree = Entry + uVar3 * 2;
        for (lVar7 = 0; lVar7 < (int)uVar3; lVar7 = lVar7 + 1) {
          pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,(int)lVar7);
          Entry[lVar7] = pAVar2;
          Entry[p->vClassNew->nSize + lVar7] = (Aig_Obj_t *)0x0;
          if (lVar7 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = *Entry;
          }
          *(Aig_Obj_t **)
           (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8) =
               pAVar5;
          pVVar6 = p->vClassNew;
          uVar3 = (ulong)(uint)pVVar6->nSize;
        }
        if (*Entry == (Aig_Obj_t *)0x0) {
          __assert_fail("ppClass[0] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                        ,0x239,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
        }
        Vec_PtrPush(p->vClasses,Entry);
        if (fRefineNewClass == 0) {
          iVar8 = 1;
          if (pSkipped != (int *)0x0) {
            *pSkipped = *pSkipped + 1;
          }
        }
        else {
          iVar8 = Fra_RefineClassLastIter(p,p->vClasses);
          iVar8 = iVar8 + 1;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int Fra_ClassesRefine1( Fra_Cla_t * p, int fRefineNewClass, int * pSkipped )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, k, nRefis = 1;
    // check if there is anything to refine
    if ( Vec_PtrSize(p->vClasses1) == 0 )
        return 0;
    // make sure constant 1 class contains only non-constant nodes
    assert( Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig) );
    // collect all the nodes to be refined
    k = 0;
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
    {
        if ( p->pFuncNodeIsConst( pObj ) )
            Vec_PtrWriteEntry( p->vClasses1, k++, pObj );
        else 
            Vec_PtrPush( p->vClassNew, pObj );
    }
    Vec_PtrShrink( p->vClasses1, k );
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
/*
    printf( "Refined const-1 class: {" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( " %d", pObj->Id );
    printf( " }\n" );
*/
    if ( Vec_PtrSize(p->vClassNew) == 1 )
    {
        Fra_ClassObjSetRepr( (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0), NULL );
        return 1;
    }
    // create a new class composed of these nodes
    ppClass = p->pMemClassesFree;
    p->pMemClassesFree += 2 * Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    assert( ppClass[0] != NULL );
    Vec_PtrPush( p->vClasses, ppClass );
    // iteratively refine this class
    if ( fRefineNewClass )
        nRefis += Fra_RefineClassLastIter( p, p->vClasses );
    else if ( pSkipped )
        (*pSkipped)++;
    return nRefis;
}